

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void __thiscall Fossilize::StateReplayer::StateReplayer(StateReplayer *this)

{
  Impl *this_00;
  
  this_00 = (Impl *)operator_new(0x1d0);
  Impl::Impl(this_00);
  this->impl = this_00;
  return;
}

Assistant:

StateReplayer::StateReplayer()
{
	impl = new Impl;
}